

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O0

bool FileSysUtilsGetParentPath(string *file_path,string *parent_path)

{
  bool bVar1;
  string local_78 [32];
  long local_58;
  size_type lastSeparator;
  undefined1 local_40 [8];
  string full_path;
  string *parent_path_local;
  string *file_path_local;
  
  full_path.field_2._8_8_ = parent_path;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = FileSysUtilsGetAbsolutePath(file_path,(string *)local_40);
  if (bVar1) {
    local_58 = std::__cxx11::string::find_last_of((char)local_40,0x2f);
    if (local_58 == 0) {
      std::__cxx11::string::string(local_78,(string *)local_40);
    }
    else {
      std::__cxx11::string::substr((ulong)local_78,(ulong)local_40);
    }
    std::__cxx11::string::operator=((string *)full_path.field_2._8_8_,local_78);
    std::__cxx11::string::~string(local_78);
    file_path_local._7_1_ = true;
  }
  else {
    file_path_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_40);
  return file_path_local._7_1_;
}

Assistant:

bool FileSysUtilsGetParentPath(const std::string& file_path, std::string& parent_path) {
    std::string full_path;
    if (FileSysUtilsGetAbsolutePath(file_path, full_path)) {
        std::string::size_type lastSeparator = full_path.find_last_of(DIRECTORY_SYMBOL);
        parent_path = (lastSeparator == 0) ? full_path : full_path.substr(0, lastSeparator);
        return true;
    }
    return false;
}